

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_symlink(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  JSValue val1_00;
  JSValue JVar1;
  JSContext *ctx_00;
  char *__to;
  ssize_t sVar2;
  int err;
  char *linkpath;
  char *target;
  undefined1 in_stack_ffffffffffffff88 [12];
  undefined4 in_stack_ffffffffffffff94;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  val1.tag._4_4_ = in_stack_ffffffffffffff94;
  val1._0_12_ = in_stack_ffffffffffffff88;
  ctx_00 = (JSContext *)JS_ToCString((JSContext *)0x117182,val1);
  if (ctx_00 == (JSContext *)0x0) {
    local_30 = 0;
    local_28 = 6;
  }
  else {
    val1_00.tag._4_4_ = in_stack_ffffffffffffff94;
    val1_00._0_12_ = in_stack_ffffffffffffff88;
    __to = JS_ToCString((JSContext *)0x1171bc,val1_00);
    if (__to == (char *)0x0) {
      JS_FreeCString(ctx_00,(char *)0x0);
      local_30 = 0;
      local_28 = 6;
    }
    else {
      symlink((char *)ctx_00,__to);
      sVar2 = js_get_errno(0x117202);
      local_30 = (undefined4)sVar2;
      JS_FreeCString(ctx_00,__to);
      JS_FreeCString(ctx_00,__to);
      uStack_2c = uStack_c;
      local_28 = 0;
    }
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_os_symlink(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    const char *target, *linkpath;
    int err;
    
    target = JS_ToCString(ctx, argv[0]);
    if (!target)
        return JS_EXCEPTION;
    linkpath = JS_ToCString(ctx, argv[1]);
    if (!linkpath) {
        JS_FreeCString(ctx, target);
        return JS_EXCEPTION;
    }
    err = js_get_errno(symlink(target, linkpath));
    JS_FreeCString(ctx, target);
    JS_FreeCString(ctx, linkpath);
    return JS_NewInt32(ctx, err);
}